

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DbFree(sqlite3 *db,void *p)

{
  uint uVar1;
  int *piVar2;
  
  if (db != (sqlite3 *)0x0) {
    piVar2 = db->pnBytesFreed;
    if (piVar2 == (int *)0x0) {
      if (((p == (void *)0x0) || (p < (db->lookaside).pStart)) || ((db->lookaside).pEnd <= p))
      goto LAB_0014718d;
      *(LookasideSlot **)p = (db->lookaside).pFree;
      (db->lookaside).pFree = (LookasideSlot *)p;
      piVar2 = &(db->lookaside).nOut;
      *piVar2 = *piVar2 + -1;
    }
    else {
      if (((p == (void *)0x0) || (p < (db->lookaside).pStart)) || ((db->lookaside).pEnd <= p)) {
        uVar1 = (*sqlite3Config.m.xSize)(p);
        piVar2 = db->pnBytesFreed;
      }
      else {
        uVar1 = (uint)(db->lookaside).sz;
      }
      *piVar2 = *piVar2 + uVar1;
    }
    return;
  }
LAB_0014718d:
  sqlite3_free(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DbFree(sqlite3 *db, void *p){
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  if( db ){
    if( db->pnBytesFreed ){
      *db->pnBytesFreed += sqlite3DbMallocSize(db, p);
      return;
    }
    if( isLookaside(db, p) ){
      LookasideSlot *pBuf = (LookasideSlot*)p;
#if SQLITE_DEBUG
      /* Trash all content in the buffer being freed */
      memset(p, 0xaa, db->lookaside.sz);
#endif
      pBuf->pNext = db->lookaside.pFree;
      db->lookaside.pFree = pBuf;
      db->lookaside.nOut--;
      return;
    }
  }
  assert( sqlite3MemdebugHasType(p, MEMTYPE_DB) );
  assert( sqlite3MemdebugHasType(p, MEMTYPE_LOOKASIDE|MEMTYPE_HEAP) );
  assert( db!=0 || sqlite3MemdebugNoType(p, MEMTYPE_LOOKASIDE) );
  sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
  sqlite3_free(p);
}